

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<long,_long>::Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<long,_long> *this,long value,bool is_valid)

{
  byte bVar1;
  long lVar2;
  byte in_DL;
  BitpackingState<long,_long> *in_RSI;
  long in_RDI;
  bool success;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar3;
  undefined1 local_1b;
  undefined1 local_1;
  
  bVar1 = in_DL & 1;
  *(byte *)(in_RDI + 0x8010 + *(long *)(in_RDI + 0x8810)) = bVar1;
  local_1b = 0;
  if ((*(byte *)(in_RDI + 0x8860) & 1) != 0) {
    local_1b = bVar1;
  }
  *(byte *)(in_RDI + 0x8860) = local_1b;
  bVar3 = 0;
  if ((*(byte *)(in_RDI + 0x8861) & 1) != 0) {
    bVar3 = bVar1 ^ 0xff;
  }
  *(byte *)(in_RDI + 0x8861) = bVar3 & 1;
  if (bVar1 != 0) {
    *(BitpackingState<long,_long> **)(*(long *)(in_RDI + 0x4008) + *(long *)(in_RDI + 0x8810) * 8) =
         in_RSI;
    lVar2 = MinValue<long>(*(long *)(in_RDI + 0x8828),(long)in_RSI);
    *(long *)(in_RDI + 0x8828) = lVar2;
    lVar2 = MaxValue<long>(*(long *)(in_RDI + 0x8830),(long)in_RSI);
    *(long *)(in_RDI + 0x8830) = lVar2;
  }
  *(long *)(in_RDI + 0x8810) = *(long *)(in_RDI + 0x8810) + 1;
  if (*(long *)(in_RDI + 0x8810) == 0x800) {
    local_1 = Flush<duckdb::EmptyBitpackingWriter>(in_RSI);
    Reset((BitpackingState<long,_long> *)CONCAT17(bVar3,in_stack_ffffffffffffffd0));
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}